

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::SubroutineIndexNonCont::Run(SubroutineIndexNonCont *this)

{
  UniformValueGenerator *generator;
  long lVar1;
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  subroutineUniforms;
  SubroutineFunctionSet functions_st0;
  undefined1 local_180 [24];
  _Alloc_hider local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158 [2];
  pointer local_130;
  pointer local_120;
  undefined1 local_110 [216];
  _Alloc_hider local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  generator = &(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator;
  SubroutineFunctionSet::SubroutineFunctionSet(&functions_st0,generator,0);
  SubroutineFunction::SubroutineFunction
            ((SubroutineFunction *)local_180,generator,(Index)ZEXT812(0));
  SubroutineFunctionSet::push_back(&functions_st0,(SubroutineFunction *)local_180);
  if ((undefined1 *)local_110._120_8_ != local_110 + 0x88) {
    operator_delete((void *)local_110._120_8_,local_110._136_8_ + 1);
  }
  UniformValue::~UniformValue((UniformValue *)(local_180 + 0x10));
  SubroutineFunction::SubroutineFunction
            ((SubroutineFunction *)local_180,generator,(Index)ZEXT812(2));
  SubroutineFunctionSet::push_back(&functions_st0,(SubroutineFunction *)local_180);
  if ((undefined1 *)local_110._120_8_ != local_110 + 0x88) {
    operator_delete((void *)local_110._120_8_,local_110._136_8_ + 1);
  }
  UniformValue::~UniformValue((UniformValue *)(local_180 + 0x10));
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SubroutineUniform::SubroutineUniform
            ((SubroutineUniform *)local_180,generator,&functions_st0,(Loc)ZEXT812(2),0,
             (DefOccurence)0x2,true);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::push_back(&subroutineUniforms,(value_type *)local_180);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_p != &local_28) {
    operator_delete(local_38._M_p,local_28._M_allocated_capacity + 1);
  }
  UniformValue::~UniformValue((UniformValue *)local_110);
  if (local_130 != (pointer)0x0) {
    operator_delete(local_130,(long)local_120 - (long)local_130);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_p != local_158) {
    operator_delete(local_168._M_p,local_158[0]._M_allocated_capacity + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ::~vector((vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
             *)local_180);
  lVar1 = ExplicitUniformLocationCaseBase::doRun
                    (&this->super_ExplicitUniformLocationCaseBase,&subroutineUniforms);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::~vector(&subroutineUniforms);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)functions_st0.typeName._M_dataplus._M_p != &functions_st0.typeName.field_2) {
    operator_delete(functions_st0.typeName._M_dataplus._M_p,
                    functions_st0.typeName.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<glcts::(anonymous_namespace)::SubroutineFunction,_std::allocator<glcts::(anonymous_namespace)::SubroutineFunction>_>
  ::~vector(&functions_st0.fn);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		//one shader:

		//subroutine vec4 st0(float param);
		SubroutineFunctionSet functions_st0(uniformValueGenerator);
		//layout(index = 0) subroutine(st0) vec4 sf0(float param) { .... };
		functions_st0.push_back(SubroutineFunction(uniformValueGenerator, Index::C(0)));
		//layout(index = 2) subroutine(st0) vec4 sf1(float param) { .... };
		functions_st0.push_back(SubroutineFunction(uniformValueGenerator, Index::C(2)));

		std::vector<SubroutineUniform> subroutineUniforms;

		//layout(location = 2) subroutine uniform st0 u0;
		subroutineUniforms.push_back(
			SubroutineUniform(uniformValueGenerator, functions_st0, Loc::C(2), 0, DefOccurence::FSH_OR_CSH));
		return doRun(subroutineUniforms);
	}